

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O0

void Rwt_Man5ExploreStart(void)

{
  Rwr_Man5_t *__s;
  stmm_table *psVar1;
  Rwr_Man5_t *p;
  
  __s = (Rwr_Man5_t *)malloc(0x10);
  memset(__s,0,0x10);
  psVar1 = stmm_init_table(st__numcmp,st__numhash);
  __s->tTableNN = psVar1;
  psVar1 = stmm_init_table(st__numcmp,st__numhash);
  __s->tTableNPN = psVar1;
  s_pManRwrExp5 = __s;
  return;
}

Assistant:

void Rwt_Man5ExploreStart()
{
    Rwr_Man5_t * p;
    p = ABC_ALLOC( Rwr_Man5_t, 1 );
    memset( p, 0, sizeof(Rwr_Man5_t) );
    p->tTableNN  = stmm_init_table( st__numcmp, st__numhash );
    p->tTableNPN = stmm_init_table( st__numcmp, st__numhash );
    s_pManRwrExp5 = p;

//Extra_PrintHex( stdout, Extra_TruthCanonNPN( 0x0000FFFF, 5 ), 5 );
//printf( "\n" );
}